

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_initCCtx(ZSTD_CCtx *cctx,ZSTD_customMem memManager)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [24];
  undefined1 auVar7 [28];
  undefined1 auVar6 [32];
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2a8d,"void ZSTD_initCCtx(ZSTD_CCtx *, ZSTD_customMem)");
  }
  memset(cctx,0,0x488);
  (cctx->customMem).customAlloc = memManager.customAlloc;
  (cctx->customMem).customFree = memManager.customFree;
  (cctx->customMem).opaque = memManager.opaque;
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar3 = 0;
  if ((*puVar1 != 0) && (uVar3 = 0, 6 < *puVar1)) {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar3 = *(uint *)(lVar2 + 4) >> 8 & 1;
  }
  cctx->bmi2 = uVar3;
  ZSTD_clearAllDicts(cctx);
  auVar6 = ZEXT1632(ZEXT816(0) << 0x40);
  auVar4 = auVar6._0_12_;
  (cctx->requestedParams).fParams.contentSizeFlag = auVar4._0_4_;
  (cctx->requestedParams).fParams.checksumFlag = auVar4._4_4_;
  (cctx->requestedParams).fParams.noDictIDFlag = auVar4._8_4_;
  (cctx->requestedParams).compressionLevel = auVar6._12_4_;
  (cctx->requestedParams).forceWindow = auVar6._16_4_;
  *(int *)&(cctx->requestedParams).field_0x34 = auVar6._20_4_;
  (cctx->requestedParams).targetCBlockSize = auVar6._24_8_;
  *(undefined1 (*) [32])&(cctx->requestedParams).ldmParams.hashRateLog = auVar6;
  auVar6 = ZEXT1632(ZEXT816(0) << 0x40);
  auVar5 = auVar6._0_24_;
  (cctx->requestedParams).ldmParams.enableLdm = auVar5._0_4_;
  (cctx->requestedParams).ldmParams.hashLog = auVar5._4_4_;
  (cctx->requestedParams).ldmParams.bucketSizeLog = auVar5._8_4_;
  (cctx->requestedParams).ldmParams.minMatchLength = auVar5._12_4_;
  (cctx->requestedParams).ldmParams.hashRateLog = auVar5._16_4_;
  (cctx->requestedParams).ldmParams.windowLog = auVar5._20_4_;
  (cctx->requestedParams).customMem.customAlloc = (ZSTD_allocFunction)auVar6._24_8_;
  (cctx->requestedParams).srcSizeHint = auVar6._0_4_;
  (cctx->requestedParams).attachDictPref = auVar6._4_4_;
  (cctx->requestedParams).literalCompressionMode = auVar6._8_4_;
  (cctx->requestedParams).nbWorkers = auVar6._12_4_;
  (cctx->requestedParams).jobSize = auVar6._16_8_;
  (cctx->requestedParams).overlapLog = auVar6._24_4_;
  (cctx->requestedParams).rsyncable = auVar6._28_4_;
  auVar7 = auVar6._4_28_;
  (cctx->requestedParams).format = auVar6._0_4_;
  (cctx->requestedParams).cParams.windowLog = auVar7._0_4_;
  (cctx->requestedParams).cParams.chainLog = auVar7._4_4_;
  (cctx->requestedParams).cParams.hashLog = auVar7._8_4_;
  (cctx->requestedParams).cParams.searchLog = auVar7._12_4_;
  (cctx->requestedParams).cParams.minMatch = auVar7._16_4_;
  (cctx->requestedParams).cParams.targetLength = auVar7._20_4_;
  (cctx->requestedParams).cParams.strategy = auVar7._24_4_;
  (cctx->requestedParams).compressionLevel = 3;
  (cctx->requestedParams).fParams.contentSizeFlag = 1;
  return;
}

Assistant:

static void ZSTD_initCCtx(ZSTD_CCtx* cctx, ZSTD_customMem memManager)
{
    assert(cctx != NULL);
    memset(cctx, 0, sizeof(*cctx));
    cctx->customMem = memManager;
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    {   size_t const err = ZSTD_CCtx_reset(cctx, ZSTD_reset_parameters);
        assert(!ZSTD_isError(err));
        (void)err;
    }
}